

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O2

void __thiscall
wasm::ParamUtils::localizeCallsTo::LocalizerPass::~LocalizerPass(LocalizerPass *this)

{
  ~LocalizerPass(this);
  operator_delete(this,0x160);
  return;
}

Assistant:

std::unique_ptr<Pass> create() override {
      return std::make_unique<LocalizerPass>(callTargets, onChange);
    }